

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::CastFromBitToNumeric::Operation<duckdb::string_t,duckdb::uhugeint_t>
          (CastFromBitToNumeric *this,string_t input,uhugeint_t *result,CastParameters *parameters)

{
  optional_idx error_location;
  ConversionException *this_00;
  string local_40;
  
  if (0xffffffffffffffee < ((ulong)this & 0xffffffff) - 0x12) {
    Bit::BitToNumeric<duckdb::uhugeint_t>((Bit *)this,(bitstring_t)input.value,result);
    return true;
  }
  this_00 = (ConversionException *)__cxa_allocate_exception(0x10);
  error_location.index = result[2].lower;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Bitstring doesn\'t fit inside of %s","");
  ConversionException::ConversionException<duckdb::PhysicalType>
            (this_00,error_location,&local_40,UINT128);
  __cxa_throw(this_00,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

bool TryCast::Operation(bool input, float &result, bool strict) {
	return NumericTryCast::Operation<bool, float>(input, result, strict);
}